

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

int __thiscall
pstore::brokerface::channel<std::condition_variable>::remove
          (channel<std::condition_variable> *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  _Node_iterator_base<pstore::brokerface::subscriber<std::condition_variable>_*,_false> local_30;
  _Node_iterator_base<pstore::brokerface::subscriber<std::condition_variable>_*,_false> local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  subscriber_type *sub_local;
  channel<std::condition_variable> *this_local;
  
  lock._M_device = (mutex_type *)__filename;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mut_);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<pstore::brokerface::subscriber<std::condition_variable>_*,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>_>
       ::find(&this->subscribers_,(key_type *)&lock);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<pstore::brokerface::subscriber<std::condition_variable>_*,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>_>
       ::end(&this->subscribers_);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (!bVar1) {
    assert_failed("subscribers_.find (sub) != subscribers_.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/brokerface/pubsub.hpp"
                  ,0x130);
  }
  std::
  unordered_set<pstore::brokerface::subscriber<std::condition_variable>_*,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>_>
  ::erase(&this->subscribers_,(key_type *)&lock);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_EAX;
}

Assistant:

void channel<ConditionVariable>::remove (subscriber_type * sub) noexcept {
            std::lock_guard<std::mutex> const lock{mut_};
            PSTORE_ASSERT (subscribers_.find (sub) != subscribers_.end ());
            subscribers_.erase (sub);
        }